

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O2

gdsBOUNDARY *
draw2ptBox(gdsBOUNDARY *__return_storage_ptr__,int layer,int blX,int blY,int trX,int trY)

{
  vector<int,_std::allocator<int>_> ptsY;
  vector<int,_std::allocator<int>_> ptsX;
  
  ptsX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ptsX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ptsX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ptsY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ptsY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ptsY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&ptsX,5);
  std::vector<int,_std::allocator<int>_>::resize(&ptsY,5);
  *ptsX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = blX
  ;
  *ptsY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = blY
  ;
  ptsX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[1] =
       trX;
  ptsY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[1] =
       blY;
  ptsX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[2] =
       trX;
  ptsY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[2] =
       trY;
  ptsX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[3] =
       blX;
  ptsY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[3] =
       trY;
  ptsX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[4] =
       blX;
  ptsY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[4] =
       blY;
  drawBoundary(__return_storage_ptr__,layer,&ptsX,&ptsY);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ptsY.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ptsX.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

gdsBOUNDARY draw2ptBox(int layer, int blX, int blY, int trX, int trY)
{
  vector<int> ptsX;
  vector<int> ptsY;

  ptsX.resize(5);
  ptsY.resize(5);

  ptsX[0] = blX;
  ptsY[0] = blY;
  ptsX[1] = trX;
  ptsY[1] = blY;
  ptsX[2] = trX;
  ptsY[2] = trY;
  ptsX[3] = blX;
  ptsY[3] = trY;
  ptsX[4] = blX;
  ptsY[4] = blY;

  return drawBoundary(layer, ptsX, ptsY);
}